

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::isPageSizesMultiplication
          (SparseTextureClampLookupColorTestCase *this,GLint target,GLint level)

{
  int local_2c;
  int local_28;
  GLint depth;
  GLint height;
  GLint width;
  GLint level_local;
  GLint target_local;
  SparseTextureClampLookupColorTestCase *this_local;
  
  height = level;
  width = target;
  _level_local = this;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTextureClampLookupResidencyTestCase).
                     super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                     super_SparseTextureCommitmentTestCase.mState,level,&depth,&local_28,&local_2c);
  if (width == 0x8513) {
    local_2c = local_2c * 6;
  }
  if (((depth % (this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mState.pageSizeX == 0) &&
      (local_28 %
       (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
       super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.pageSizeY
       == 0)) &&
     (local_2c %
      (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.pageSizeZ
      == 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::isPageSizesMultiplication(GLint target, GLint level)
{
	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	if ((width % mState.pageSizeX) == 0 && (height % mState.pageSizeY) == 0 && (depth % mState.pageSizeZ) == 0)
	{
		return true;
	}

	return false;
}